

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

LargeHeapBlock *
Memory::LargeHeapBlock::New
          (char *address,size_t pageCount,Segment *segment,uint objectCount,LargeHeapBucket *bucket)

{
  HeapAllocator *pHVar1;
  size_t size;
  LargeHeapBlock *this;
  TrackAllocData local_58;
  LargeHeapBucket *local_30;
  LargeHeapBucket *bucket_local;
  Segment *pSStack_20;
  uint objectCount_local;
  Segment *segment_local;
  size_t pageCount_local;
  char *address_local;
  
  local_30 = bucket;
  bucket_local._4_4_ = objectCount;
  pSStack_20 = segment;
  segment_local = (Segment *)pageCount;
  pageCount_local = (size_t)address;
  pHVar1 = HeapAllocator::GetNoMemProtectInstance();
  size = GetAllocPlusSize(bucket_local._4_4_);
  TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,size,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
             ,0xa6);
  pHVar1 = HeapAllocator::TrackAllocInfo(pHVar1,&local_58);
  GetAllocPlusSize(bucket_local._4_4_);
  this = (LargeHeapBlock *)new<Memory::HeapAllocator>(0xb8,pHVar1,true,0x282340,0);
  LargeHeapBlock(this,(char *)pageCount_local,(size_t)segment_local,pSStack_20,bucket_local._4_4_,
                 local_30);
  return this;
}

Assistant:

LargeHeapBlock *
LargeHeapBlock::New(__in char * address, DECLSPEC_GUARD_OVERFLOW size_t pageCount, Segment * segment, DECLSPEC_GUARD_OVERFLOW uint objectCount, LargeHeapBucket* bucket)
{
    return NoMemProtectHeapNewNoThrowPlusZ(GetAllocPlusSize(objectCount), LargeHeapBlock, address, pageCount, segment, objectCount, bucket);
}